

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTexture.cpp
# Opt level: O2

ostream * tcu::operator<<(ostream *str,ConstPixelBufferAccess *access)

{
  ostream *poVar1;
  
  poVar1 = std::operator<<(str,"format = (");
  poVar1 = operator<<(poVar1,access->m_format);
  poVar1 = std::operator<<(poVar1,"), size = ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(access->m_size).m_data[0]);
  poVar1 = std::operator<<(poVar1," x ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(access->m_size).m_data[1]);
  poVar1 = std::operator<<(poVar1," x ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(access->m_size).m_data[2]);
  poVar1 = std::operator<<(poVar1,", pitch = ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(access->m_pitch).m_data[1]);
  poVar1 = std::operator<<(poVar1," / ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(access->m_pitch).m_data[2]);
  return poVar1;
}

Assistant:

std::ostream& operator<< (std::ostream& str, const ConstPixelBufferAccess& access)
{
	return str << "format = (" << access.getFormat() << "), size = "
			   << access.getWidth() << " x " << access.getHeight() << " x " << access.getDepth()
			   << ", pitch = " << access.getRowPitch() << " / " << access.getSlicePitch();
}